

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIChain.cpp
# Opt level: O2

void __thiscall
adios2::aggregator::MPIChain::ResizeUpdateBuffer
          (MPIChain *this,size_t newSize,Buffer *buffer,string *hint)

{
  allocator local_19b;
  allocator local_19a;
  allocator local_199;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  if (buffer->m_FixedSize == 0) {
    std::__cxx11::string::string(local_38,(string *)hint);
    (*buffer->_vptr_Buffer[4])(buffer,newSize,local_38);
    std::__cxx11::string::~string(local_38);
    buffer->m_Position = newSize;
  }
  else if (buffer->m_FixedSize < newSize) {
    std::__cxx11::string::string((string *)&local_58,"Toolkit",&local_199);
    std::__cxx11::string::string((string *)&local_78,"aggregator::mpi::MPIChain",&local_19a);
    std::__cxx11::string::string((string *)&local_98,"ResizeUpdateBuffer",&local_19b);
    std::__cxx11::to_string(&local_178,newSize);
    std::operator+(&local_158,"requesting new size: ",&local_178);
    std::operator+(&local_138,&local_158," bytes, for fixed size buffer ");
    std::__cxx11::to_string(&local_198,buffer->m_FixedSize);
    std::operator+(&local_118,&local_138,&local_198);
    std::operator+(&local_f8,&local_118," of type ");
    std::operator+(&local_d8,&local_f8,&buffer->m_Type);
    std::operator+(&local_b8,&local_d8,", allocate more memory");
    helper::Throw<std::invalid_argument>(&local_58,&local_78,&local_98,&local_b8,-1);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return;
}

Assistant:

void MPIChain::ResizeUpdateBuffer(const size_t newSize, format::Buffer &buffer,
                                  const std::string hint)
{
    if (buffer.m_FixedSize > 0)
    {
        if (newSize > buffer.m_FixedSize)
        {
            helper::Throw<std::invalid_argument>(
                "Toolkit", "aggregator::mpi::MPIChain", "ResizeUpdateBuffer",
                "requesting new size: " + std::to_string(newSize) +
                    " bytes, for fixed size buffer " + std::to_string(buffer.m_FixedSize) +
                    " of type " + buffer.m_Type + ", allocate more memory");
        }
        return; // do nothing if fixed size is enough
    }

    buffer.Resize(newSize, hint);
    buffer.m_Position = newSize;
}